

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
          (char *expected_expression,char *actual_expression,char (*expected) [7],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  bool bVar1;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  value_type *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  AssertionResult AVar3;
  String *unaff_retaddr;
  String *in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  value_type *str;
  char (*in_stack_ffffffffffffffd0) [7];
  value_type *pvVar4;
  undefined1 ignoring_case;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  str = in_RDI;
  pvVar4 = in_RDI;
  bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  ignoring_case = (undefined1)((ulong)pvVar4 >> 0x38);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    FormatForComparisonFailureMessage(str,in_RDX);
    FormatForComparisonFailureMessage<std::__cxx11::string,char[7]>(in_R8,in_stack_ffffffffffffffd0)
    ;
    EqFailure(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
              (bool)ignoring_case);
    String::~String((String *)in_RDX);
    String::~String((String *)in_RDX);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                               // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}